

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall glcts::anon_unknown_0::Uniform::Uniform(Uniform *this,Uniform *param_1)

{
  NumSys NVar1;
  Uniform *param_1_local;
  Uniform *this_local;
  
  UniformType::UniformType(&this->type,&param_1->type);
  NVar1 = (param_1->location).super_LayoutSpecifierBase.numSys;
  (this->location).super_LayoutSpecifierBase.val = (param_1->location).super_LayoutSpecifierBase.val
  ;
  (this->location).super_LayoutSpecifierBase.numSys = NVar1;
  *(undefined8 *)&(this->location).super_LayoutSpecifierBase.occurence =
       *(undefined8 *)&(param_1->location).super_LayoutSpecifierBase.occurence;
  (this->usageOccurence).occurence = (param_1->usageOccurence).occurence;
  UniformValue::UniformValue(&this->value,&param_1->value);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector(&this->childUniforms,&param_1->childUniforms);
  std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  std::__cxx11::string::string((string *)&this->shortName,(string *)&param_1->shortName);
  return;
}

Assistant:

Uniform(UniformValueGenerator& generator, UniformType _type, Loc _location,
			DefOccurence _declOccurence = DefOccurence::ALL_SH, DefOccurence _usageOccurence = DefOccurence::ALL_SH)
		: type(_type)
		, location(_location)
		, declOccurence(_declOccurence)
		, usageOccurence(_usageOccurence)
		, value(_type, generator)
	{

		if (type.isStruct())
		{
			int currentLocation = location.val;
			for (int arrayElem = 0; arrayElem < type.arraySize; arrayElem++)
			{
				for (size_t child = 0; child < type.childTypes.size(); child++)
				{
					Loc childLocation = Loc::Implicit();
					if (currentLocation > 0)
					{
						childLocation = Loc::C(currentLocation);
					}
					childUniforms.push_back(
						Uniform(generator, type.childTypes[child], childLocation, declOccurence, usageOccurence));
					currentLocation += type.childTypes[child].arraySize;
				}
			}
		}
	}